

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

PSBTAnalysis *
node::AnalyzePSBT(PSBTAnalysis *__return_storage_ptr__,PartiallySignedTransaction psbtx)

{
  pointer pPVar1;
  long *plVar2;
  pointer pCVar3;
  string err_msg;
  string err_msg_00;
  string err_msg_01;
  string err_msg_02;
  PartiallySignedTransaction psbt;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 extraout_RAX;
  uchar *puVar9;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long lVar10;
  pointer pCVar11;
  ulong uVar12;
  int64_t nSigOpCost;
  unsigned_long uVar13;
  PSBTRole PVar14;
  ulong uVar15;
  undefined8 uVar16;
  PSBTRole *pPVar17;
  int index;
  PartiallySignedTransaction *in_RSI;
  _Alloc_hider _Var18;
  pointer pPVar19;
  long in_FS_OFFSET;
  bool bVar20;
  SignatureData outdata;
  PrecomputedTransactionData txdata;
  undefined4 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86c [19];
  byte in_stack_fffffffffffff87f;
  PSBTAnalysis *this;
  uchar *puVar21;
  SigningProvider *pSVar22;
  ulong uVar23;
  undefined4 in_stack_fffffffffffff898;
  uint uVar24;
  vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  _Storage<CFeeRate,_true> in_stack_fffffffffffff8b8;
  CCoinsView in_stack_fffffffffffff8c0;
  uint input_index;
  undefined4 in_stack_fffffffffffff8cc;
  undefined1 in_stack_fffffffffffff8d0 [40];
  undefined8 in_stack_fffffffffffff8f8;
  CAmount in_stack_fffffffffffff900;
  pointer in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff918 [20];
  uint in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff934 [60];
  long *local_678 [2];
  long local_668 [2];
  undefined1 local_658 [200];
  _Rb_tree_node_base local_590;
  ListNode *local_570;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 local_520;
  direct_or_indirect local_510;
  uint local_4f4;
  undefined1 local_4f0 [16];
  PoolResource<144UL,_8UL> *local_4e0;
  PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>
  local_4d8;
  __buckets_ptr local_4d0;
  _Rb_tree_node_base local_4c0;
  __node_base_ptr local_4a0;
  pointer puStack_498;
  pointer local_490;
  pointer puStack_488;
  _Rb_tree_node_base local_478;
  size_t local_458;
  _Rb_tree_node_base local_448;
  size_t local_428;
  _Rb_tree_node_base local_418;
  size_t local_3f8;
  vector<CKeyID,_std::allocator<CKeyID>_> vStack_3f0;
  vector<CKeyID,_std::allocator<CKeyID>_> local_3d8;
  uchar auStack_3c0 [20];
  undefined4 uStack_3ac;
  uchar local_3a8 [40];
  _Rb_tree_node_base local_380;
  size_t local_360;
  _Rb_tree_node_base local_350;
  size_t local_330;
  _Rb_tree_node_base local_320;
  size_t local_300;
  _Rb_tree_node_base local_2f0;
  size_t local_2d0;
  PartiallySignedTransaction local_2c8;
  string local_1c0;
  string local_1a0;
  string local_180;
  PrecomputedTransactionData local_160;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = false;
  (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = false;
  (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar25 = &(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar25;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
  this_00 = &__return_storage_ptr__->inputs;
  this = __return_storage_ptr__;
  std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::resize
            (this_00,((long)*(pointer *)
                             ((long)&(in_RSI->tx).
                                     super__Optional_base<CMutableTransaction,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                     .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                     _M_value.vin + 8) -
                      *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>
                                ._M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin >> 3) * 0x4ec4ec4ec4ec4ec5);
  PrecomputePSBTData(&local_160,in_RSI);
  input_index = 0;
  bVar20 = *(pointer *)
            ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                    super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                    super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8)
           == *(pointer *)
               &(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
  bVar5 = !bVar20;
  if (bVar20) {
    uVar24 = 1;
    puVar21 = (uchar *)0x0;
    uVar23 = 0;
  }
  else {
    uVar24 = (uint)CONCAT71((int7)((ulong)DUMMY_SIGNING_PROVIDER >> 8),1);
    uVar8 = 0;
    uVar23 = 0;
    puVar21 = (uchar *)0x0;
    __return_storage_ptr__ = this;
    pSVar22 = DUMMY_SIGNING_PROVIDER;
    do {
      pPVar1 = (in_RSI->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar19 = (this_00->
                super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pPVar19[uVar8].next = EXTRACTOR;
      CTxOut::CTxOut((CTxOut *)&stack0xfffffffffffff908);
      bVar20 = PartiallySignedTransaction::GetInputUTXO
                         (in_RSI,(CTxOut *)&stack0xfffffffffffff908,input_index);
      pPVar19 = pPVar19 + uVar8;
      if (bVar20) {
        if (((pointer)0x775f05a074000 < in_stack_fffffffffffff908) ||
           (puVar9 = (in_stack_fffffffffffff908->prevout).hash.m_wrapped.super_base_blob<256U>.
                     m_data._M_elems + (long)puVar21, (uchar *)0x775f05a074000 < puVar9)) {
          tinyformat::format<unsigned_int>
                    (&local_180,"PSBT is not valid. Input %u has invalid value",
                     (uint *)&stack0xfffffffffffff8c8);
          err_msg._4_19_ = in_stack_fffffffffffff86c;
          err_msg._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff868;
          err_msg.field_2._M_local_buf[7] = bVar5;
          err_msg.field_2._8_8_ = __return_storage_ptr__;
          PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg);
          uVar23 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          uVar16 = local_180.field_2._M_allocated_capacity;
          _Var18._M_p = local_180._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p == &local_180.field_2) goto LAB_0048b59b;
LAB_0048b593:
          operator_delete(_Var18._M_p,uVar16 + 1);
          goto LAB_0048b59b;
        }
        pPVar19->has_utxo = true;
        puVar21 = puVar9;
LAB_0048b076:
        if (in_stack_fffffffffffff908 != (pointer)0xffffffffffffffff) {
          uVar7 = in_stack_fffffffffffff92c - 0x1d;
          if (in_stack_fffffffffffff92c < 0x1d) {
            uVar7 = in_stack_fffffffffffff92c;
          }
          if (uVar7 != 0) {
            uVar16 = &stack0xfffffffffffff910;
            if (0x1c < in_stack_fffffffffffff92c) {
              uVar16 = in_stack_fffffffffffff910;
            }
            if ((10000 < uVar7) || (*(char *)uVar16 == 'j')) {
              tinyformat::format<unsigned_int>
                        (&local_1c0,"PSBT is not valid. Input %u spends unspendable output",
                         (uint *)&stack0xfffffffffffff8c8);
              err_msg_01._4_19_ = in_stack_fffffffffffff86c;
              err_msg_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff868;
              err_msg_01.field_2._M_local_buf[7] = bVar5;
              err_msg_01.field_2._8_8_ = __return_storage_ptr__;
              PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg_01);
              uVar23 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              uVar16 = local_1c0.field_2._M_allocated_capacity;
              _Var18._M_p = local_1c0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_0048b59b;
              goto LAB_0048b593;
            }
          }
        }
        PartiallySignedTransaction::PartiallySignedTransaction(&local_2c8,in_RSI);
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._4_19_ =
             in_stack_fffffffffffff86c;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._0_4_ =
             in_stack_fffffffffffff868;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._23_1_ = bVar5;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)__return_storage_ptr__;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)puVar21;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)uVar23;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.version =
             in_stack_fffffffffffff898;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.nLockTime = uVar24;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._56_8_ = this_00;
        psbt.m_xpubs._M_t._M_impl._0_8_ = paVar25;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pSVar22;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)in_stack_fffffffffffff8b8;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)in_stack_fffffffffffff8c0._vptr_CCoinsView;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = input_index;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
             in_stack_fffffffffffff8cc;
        psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_node_count =
             in_stack_fffffffffffff8d0._0_8_;
        psbt.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<PSBTInput,_std::allocator<PSBTInput>_>)
             (_Vector_base<PSBTInput,_std::allocator<PSBTInput>_>)in_stack_fffffffffffff8d0._8_24_;
        psbt.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8d0._32_8_;
        psbt.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8f8;
        psbt.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff900;
        psbt.unknown._M_t._M_impl._0_8_ = in_stack_fffffffffffff908;
        psbt.unknown._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffff910;
        psbt.unknown._M_t._M_impl.super__Rb_tree_header._M_header._8_20_ = in_stack_fffffffffffff918
        ;
        psbt.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
             in_stack_fffffffffffff92c;
        psbt.unknown._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             in_stack_fffffffffffff930;
        psbt._204_60_ = in_stack_fffffffffffff934;
        bVar20 = PSBTInputSignedAndVerified
                           (psbt,(uint)&local_2c8,(PrecomputedTransactionData *)(ulong)input_index);
        std::
        _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
        ::~_Rb_tree(&local_2c8.m_proprietary._M_t);
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~_Rb_tree(&local_2c8.unknown._M_t);
        std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&local_2c8.outputs);
        std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&local_2c8.inputs);
        std::
        _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
        ::~_Rb_tree(&local_2c8.m_xpubs._M_t);
        std::_Optional_payload_base<CMutableTransaction>::_M_reset
                  ((_Optional_payload_base<CMutableTransaction> *)&local_2c8);
        if (bVar20) {
          bVar20 = true;
          if (in_stack_fffffffffffff908 != (pointer)0xffffffffffffffff) {
            pPVar19->is_final = true;
          }
        }
        else {
          pPVar19->is_final = false;
          local_658._0_8_ = local_658._0_8_ & 0xffffffffffff0000;
          local_590._M_color = _S_red;
          local_590._M_parent = (_Base_ptr)0x0;
          memset(local_658 + 8,0,0xb8);
          local_590._M_left = &local_590;
          local_570 = (ListNode *)0x0;
          local_510.direct[0x10] = false;
          local_4f0._0_4_ = _S_red;
          local_4f0._8_8_ = (_Base_ptr)0x0;
          local_4e0 = (PoolResource<144UL,_8UL> *)local_4f0;
          local_4d0 = (__buckets_ptr)0x0;
          local_4c0._M_color = _S_red;
          local_4c0._M_parent = (_Base_ptr)0x0;
          local_4c0._M_left = &local_4c0;
          local_478._M_color = _S_red;
          local_478._M_parent = (_Base_ptr)0x0;
          local_4a0 = (__node_base_ptr)0x0;
          puStack_498 = (pointer)0x0;
          local_490 = (pointer)0x0;
          puStack_488 = (pointer)0x0;
          local_478._M_left = &local_478;
          local_458 = 0;
          local_448._M_color = _S_red;
          local_448._M_parent = (_Base_ptr)0x0;
          local_448._M_left = &local_448;
          local_428 = 0;
          local_418._M_color = _S_red;
          local_418._M_parent = (_Base_ptr)0x0;
          local_418._M_left = &local_418;
          local_380._M_color = _S_red;
          local_380._M_parent = (_Base_ptr)0x0;
          local_3f8 = 0;
          vStack_3f0.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_3f0.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_3f0.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3d8.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3d8.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3d8.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_3c0[0] = '\0';
          auStack_3c0[1] = '\0';
          auStack_3c0[2] = '\0';
          auStack_3c0[3] = '\0';
          auStack_3c0[4] = '\0';
          auStack_3c0[5] = '\0';
          auStack_3c0[6] = '\0';
          auStack_3c0[7] = '\0';
          auStack_3c0[8] = '\0';
          auStack_3c0[9] = '\0';
          auStack_3c0[10] = '\0';
          auStack_3c0[0xb] = '\0';
          auStack_3c0[0xc] = '\0';
          auStack_3c0[0xd] = '\0';
          auStack_3c0[0xe] = '\0';
          auStack_3c0[0xf] = '\0';
          auStack_3c0[0x10] = '\0';
          auStack_3c0[0x11] = '\0';
          auStack_3c0[0x12] = '\0';
          auStack_3c0[0x13] = '\0';
          uStack_3ac._0_1_ = '\0';
          uStack_3ac._1_1_ = '\0';
          uStack_3ac._2_1_ = '\0';
          uStack_3ac._3_1_ = '\0';
          local_3a8[0] = '\0';
          local_3a8[1] = '\0';
          local_3a8[2] = '\0';
          local_3a8[3] = '\0';
          local_3a8[4] = '\0';
          local_3a8[5] = '\0';
          local_3a8[6] = '\0';
          local_3a8[7] = '\0';
          local_3a8[8] = '\0';
          local_3a8[9] = '\0';
          local_3a8[10] = '\0';
          local_3a8[0xb] = '\0';
          local_3a8[0xc] = '\0';
          local_3a8[0xd] = '\0';
          local_3a8[0xe] = '\0';
          local_3a8[0xf] = '\0';
          local_3a8[0x10] = '\0';
          local_3a8[0x11] = '\0';
          local_3a8[0x12] = '\0';
          local_3a8[0x13] = '\0';
          local_3a8[0x14] = '\0';
          local_3a8[0x15] = '\0';
          local_3a8[0x16] = '\0';
          local_3a8[0x17] = '\0';
          local_3a8[0x18] = '\0';
          local_3a8[0x19] = '\0';
          local_3a8[0x1a] = '\0';
          local_3a8[0x1b] = '\0';
          local_380._M_left = &local_380;
          local_360 = 0;
          local_350._M_color = _S_red;
          local_350._M_parent = (_Base_ptr)0x0;
          local_350._M_left = &local_350;
          local_330 = 0;
          local_320._M_color = _S_red;
          local_320._M_parent = (_Base_ptr)0x0;
          local_320._M_left = &local_320;
          local_300 = 0;
          local_2f0._M_color = _S_red;
          local_2f0._M_parent = (_Base_ptr)0x0;
          local_2f0._M_left = &local_2f0;
          local_2d0 = 0;
          in_stack_fffffffffffff868 = 1;
          local_590._M_right = local_590._M_left;
          local_4d8.m_resource = local_4e0;
          local_4c0._M_right = local_4c0._M_left;
          local_478._M_right = local_478._M_left;
          local_448._M_right = local_448._M_left;
          local_418._M_right = local_418._M_left;
          local_380._M_right = local_380._M_left;
          local_350._M_right = local_350._M_left;
          local_320._M_right = local_320._M_left;
          local_2f0._M_right = local_2f0._M_left;
          bVar20 = SignPSBTInput(pSVar22,in_RSI,input_index,&local_160,1,(SignatureData *)local_658,
                                 true);
          PVar14 = FINALIZER;
          if (!bVar20) {
            std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                      (&pPVar19->missing_pubkeys,&vStack_3f0);
            *(undefined4 *)
             ((long)&(pPVar19->missing_redeem_script).super_base_blob<160U>.m_data + 0x10) =
                 auStack_3c0._16_4_;
            *(undefined8 *)(pPVar19->missing_redeem_script).super_base_blob<160U>.m_data._M_elems =
                 auStack_3c0._0_8_;
            *(undefined8 *)
             ((long)&(pPVar19->missing_redeem_script).super_base_blob<160U>.m_data + 8) =
                 auStack_3c0._8_8_;
            *(ulong *)(pPVar19->missing_witness_script).super_base_blob<256U>.m_data._M_elems =
                 CONCAT44(local_3a8._0_4_,uStack_3ac);
            *(ulong *)((long)&(pPVar19->missing_witness_script).super_base_blob<256U>.m_data + 8) =
                 CONCAT44(local_3a8._8_4_,local_3a8._4_4_);
            *(ulong *)((long)&(pPVar19->missing_witness_script).super_base_blob<256U>.m_data + 0x10)
                 = CONCAT44(local_3a8._16_4_,local_3a8._12_4_);
            *(undefined8 *)
             ((long)&(pPVar19->missing_witness_script).super_base_blob<256U>.m_data + 0x18) =
                 local_3a8._20_8_;
            std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                      (&pPVar19->missing_sigs,&local_3d8);
            if ((((vStack_3f0.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   vStack_3f0.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                   super__Vector_impl_data._M_finish) ||
                 (puVar9 = std::
                           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                     (auStack_3c0), puVar9 != (uchar *)&uStack_3ac)) ||
                (puVar9 = std::
                          __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                    (&uStack_3ac), puVar9 != local_3a8 + 0x1c)) ||
               (PVar14 = SIGNER,
               local_3d8.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
               super__Vector_impl_data._M_start ==
               local_3d8.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
              PVar14 = UPDATER;
            }
          }
          pPVar19->next = PVar14;
          SignatureData::~SignatureData((SignatureData *)local_658);
          bVar20 = true;
        }
      }
      else {
        lVar10 = (long)pPVar1[uVar8].non_witness_utxo.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((lVar10 == 0) ||
           (uVar8 = (ulong)*(uint *)(*(long *)&(in_RSI->tx).
                                               super__Optional_base<CMutableTransaction,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                               .super__Optional_payload_base<CMutableTransaction>.
                                               _M_payload._M_value.vin + 0x20 +
                                    (ulong)input_index * 0x68),
           uVar15 = (*(long *)(lVar10 + 0x20) - *(long *)(lVar10 + 0x18) >> 3) * -0x3333333333333333
           , uVar8 <= uVar15 && uVar15 - uVar8 != 0)) {
          pPVar19->has_utxo = false;
          pPVar19->is_final = false;
          pPVar19->next = UPDATER;
          uVar24 = 0;
          goto LAB_0048b076;
        }
        tinyformat::format<unsigned_int>
                  (&local_1a0,"PSBT is not valid. Input %u specifies invalid prevout",
                   (uint *)&stack0xfffffffffffff8c8);
        err_msg_00._4_19_ = in_stack_fffffffffffff86c;
        err_msg_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff868;
        err_msg_00.field_2._M_local_buf[7] = bVar5;
        err_msg_00.field_2._8_8_ = __return_storage_ptr__;
        PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg_00);
        uVar23 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar16 = local_1a0.field_2._M_allocated_capacity;
        _Var18._M_p = local_1a0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) goto LAB_0048b593;
LAB_0048b59b:
        bVar20 = false;
      }
      if (0x1c < in_stack_fffffffffffff92c) {
        free((void *)in_stack_fffffffffffff910);
        in_stack_fffffffffffff910 = (char *)0x0;
      }
      in_stack_fffffffffffff87f = bVar5;
      this = __return_storage_ptr__;
      if (!bVar20) break;
      input_index = input_index + 1;
      uVar8 = (ulong)input_index;
      uVar15 = ((long)*(pointer *)
                       ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                               _M_payload.
                               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value
                               .vin + 8) -
                *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                          _M_payload.
                          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin
               >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar20 = uVar15 - uVar8 != 0;
      bVar5 = uVar8 <= uVar15 && bVar20;
      in_stack_fffffffffffff87f = bVar5;
    } while (uVar8 <= uVar15 && bVar20);
  }
  if ((bVar5 & 1) == 0) {
    __return_storage_ptr__->next = EXTRACTOR;
    lVar10 = (long)*(pointer *)
                    ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                            _M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vin + 8) -
             *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                       _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                       super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
    if (lVar10 != 0) {
      uVar15 = (lVar10 >> 3) * 0x4ec4ec4ec4ec4ec5;
      PVar14 = __return_storage_ptr__->next;
      pPVar17 = &((__return_storage_ptr__->inputs).
                  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>
                  ._M_impl.super__Vector_impl_data._M_start)->next;
      uVar8 = 1;
      do {
        if ((int)*pPVar17 < (int)PVar14) {
          PVar14 = *pPVar17;
        }
        __return_storage_ptr__->next = PVar14;
        pPVar17 = pPVar17 + 0x1c;
        bVar20 = uVar8 <= uVar15;
        lVar10 = uVar15 - uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar20 && lVar10 != 0);
    }
    if ((int)__return_storage_ptr__->next < 1) {
      __assert_fail("result.next > PSBTRole::CREATOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/psbt.cpp"
                    ,0x60,"PSBTAnalysis node::AnalyzePSBT(PartiallySignedTransaction)");
    }
    if ((uVar24 & 1) != 0) {
      pCVar11 = *(pointer *)
                 &(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
      pCVar3 = *(pointer *)
                ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                        _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout +
                8);
      if (pCVar11 == pCVar3) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        do {
          uVar15 = 0xffffffffffffffff;
          if (((uVar8 < 0x775f05a074001) && ((ulong)pCVar11->nValue < 0x775f05a074001)) &&
             (uVar15 = pCVar11->nValue + uVar8, 2100000000000000 < uVar15)) {
            uVar15 = 0xffffffffffffffff;
          }
          uVar8 = uVar15;
          pCVar11 = pCVar11 + 1;
        } while (pCVar11 != pCVar3);
      }
      if (uVar8 < 0x775f05a074001) {
        (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = (long)puVar21 - uVar8;
        (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = true;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)&stack0xfffffffffffff8c8,
                   (vector<CTxIn,_std::allocator<CTxIn>_> *)in_RSI);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffff8e0,
                   &(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                    super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                    super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout);
        CCoinsViewCache::CCoinsViewCache
                  ((CCoinsViewCache *)local_658,(CCoinsView *)&stack0xfffffffffffff8c0,false);
        if (*(pointer *)
             ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                     .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                     super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8)
            == *(pointer *)
                &(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin) {
LAB_0048b923:
          CTransaction::CTransaction
                    ((CTransaction *)&stack0xfffffffffffff908,
                     (CMutableTransaction *)&stack0xfffffffffffff8c8);
          nSigOpCost = GetTransactionSigOpCost
                                 ((CTransaction *)&stack0xfffffffffffff908,
                                  (CCoinsViewCache *)local_658,0x1fffdf);
          uVar13 = GetVirtualTransactionSize
                             ((CTransaction *)&stack0xfffffffffffff908,nSigOpCost,nBytesPerSigOp);
          (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar13;
          (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
          CFeeRate::CFeeRate((CFeeRate *)&stack0xfffffffffffff8b8,
                             (CAmount *)&stack0xfffffffffffff900,(uint32_t)uVar13);
          (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>.
          _M_payload.super__Optional_payload_base<CFeeRate>._M_payload = in_stack_fffffffffffff8b8;
          if ((__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>
              ._M_payload.super__Optional_payload_base<CFeeRate>._M_engaged == false) {
            (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>.
            _M_payload.super__Optional_payload_base<CFeeRate>._M_engaged = true;
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffff920);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)&stack0xfffffffffffff908);
        }
        else {
          bVar5 = 1;
          uVar15 = 0;
          __return_storage_ptr__ = this;
          pSVar22 = DUMMY_SIGNING_PROVIDER;
          do {
            pPVar1 = (in_RSI->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            CTxOut::CTxOut((CTxOut *)&stack0xfffffffffffff908);
            index = (int)uVar15;
            bVar6 = SignPSBTInput(pSVar22,in_RSI,index,(PrecomputedTransactionData *)0x0,1,
                                  (SignatureData *)0x0,true);
            bVar20 = false;
            bVar4 = 0;
            if (bVar6) {
              bVar6 = PartiallySignedTransaction::GetInputUTXO
                                (in_RSI,(CTxOut *)&stack0xfffffffffffff908,index);
              bVar20 = false;
              bVar4 = 0;
              if (bVar6) {
                lVar10 = uVar15 * 0x68;
                prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           (CONCAT44(in_stack_fffffffffffff8cc,input_index) + lVar10 + 0x28),
                           &pPVar1[uVar15].final_script_sig.super_CScriptBase);
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)(CONCAT44(in_stack_fffffffffffff8cc,input_index) + lVar10 + 0x50),
                            &pPVar1[uVar15].final_script_witness.stack);
                bVar20 = true;
                CCoinsViewCache::AddCoin
                          ((CCoinsViewCache *)local_658,
                           (COutPoint *)
                           (lVar10 + *(long *)&(in_RSI->tx).
                                               super__Optional_base<CMutableTransaction,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                               .super__Optional_payload_base<CMutableTransaction>.
                                               _M_payload._M_value.vin),
                           (Coin *)&stack0xfffffffffffff908,true);
                bVar4 = bVar5;
              }
            }
            bVar5 = bVar4;
            if (0x1c < in_stack_fffffffffffff92c) {
              free((void *)in_stack_fffffffffffff910);
              in_stack_fffffffffffff910 = (char *)0x0;
            }
          } while ((bVar20) &&
                  (uVar15 = (ulong)(index + 1),
                  uVar12 = ((long)*(pointer *)
                                   ((long)&(in_RSI->tx).
                                           super__Optional_base<CMutableTransaction,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                           .super__Optional_payload_base<CMutableTransaction>.
                                           _M_payload._M_value.vin + 8) -
                            *(long *)&(in_RSI->tx).
                                      super__Optional_base<CMutableTransaction,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                      .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                      _M_value.vin >> 3) * 0x4ec4ec4ec4ec4ec5,
                  uVar15 <= uVar12 && uVar12 - uVar15 != 0));
          if ((bVar5 & 1) != 0) goto LAB_0048b923;
        }
        local_658._0_8_ = &PTR_GetCoin_00b19380;
        std::
        _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(local_4f0 + 8));
        if (local_520 != '\0') {
          *(undefined8 *)(local_528 + 0x28) = local_530;
          *(undefined8 *)(local_530 + 0x30) = local_528;
          local_520 = '\0';
        }
        if (0x1c < local_4f4) {
          free(local_510.indirect_contents.indirect);
          local_510.indirect_contents.indirect = (char *)0x0;
        }
        PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)(local_658 + 0x38));
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffff8e0);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)&stack0xfffffffffffff8c8);
      }
      else {
        local_678[0] = local_668;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_678,"PSBT is not valid. Output amount invalid","");
        err_msg_02._4_19_ = in_stack_fffffffffffff86c;
        err_msg_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff868;
        err_msg_02.field_2._M_local_buf[7] = in_stack_fffffffffffff87f;
        err_msg_02.field_2._8_8_ = this;
        __return_storage_ptr__ = this;
        PSBTAnalysis::SetInvalid(this,err_msg_02);
        uVar23 = 1;
        if (local_678[0] != local_668) {
          operator_delete(local_678[0],local_668[0] + 1);
        }
      }
      if (2100000000000000 < uVar8) goto LAB_0048b645;
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_160.m_spent_outputs);
  }
  else {
LAB_0048b645:
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_160.m_spent_outputs);
    if ((uVar23 & 1) == 0) {
      plVar2 = (long *)(__return_storage_ptr__->error)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2 != paVar25) {
        operator_delete(plVar2,paVar25->_M_allocated_capacity + 1);
      }
      std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::~vector
                (this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PSBTAnalysis AnalyzePSBT(PartiallySignedTransaction psbtx)
{
    // Go through each input and build status
    PSBTAnalysis result;

    bool calc_fee = true;

    CAmount in_amt = 0;

    result.inputs.resize(psbtx.tx->vin.size());

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& input = psbtx.inputs[i];
        PSBTInputAnalysis& input_analysis = result.inputs[i];

        // We set next role here and ratchet backwards as required
        input_analysis.next = PSBTRole::EXTRACTOR;

        // Check for a UTXO
        CTxOut utxo;
        if (psbtx.GetInputUTXO(utxo, i)) {
            if (!MoneyRange(utxo.nValue) || !MoneyRange(in_amt + utxo.nValue)) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u has invalid value", i));
                return result;
            }
            in_amt += utxo.nValue;
            input_analysis.has_utxo = true;
        } else {
            if (input.non_witness_utxo && psbtx.tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u specifies invalid prevout", i));
                return result;
            }
            input_analysis.has_utxo = false;
            input_analysis.is_final = false;
            input_analysis.next = PSBTRole::UPDATER;
            calc_fee = false;
        }

        if (!utxo.IsNull() && utxo.scriptPubKey.IsUnspendable()) {
            result.SetInvalid(strprintf("PSBT is not valid. Input %u spends unspendable output", i));
            return result;
        }

        // Check if it is final
        if (!PSBTInputSignedAndVerified(psbtx, i, &txdata)) {
            input_analysis.is_final = false;

            // Figure out what is missing
            SignatureData outdata;
            bool complete = SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, 1, &outdata);

            // Things are missing
            if (!complete) {
                input_analysis.missing_pubkeys = outdata.missing_pubkeys;
                input_analysis.missing_redeem_script = outdata.missing_redeem_script;
                input_analysis.missing_witness_script = outdata.missing_witness_script;
                input_analysis.missing_sigs = outdata.missing_sigs;

                // If we are only missing signatures and nothing else, then next is signer
                if (outdata.missing_pubkeys.empty() && outdata.missing_redeem_script.IsNull() && outdata.missing_witness_script.IsNull() && !outdata.missing_sigs.empty()) {
                    input_analysis.next = PSBTRole::SIGNER;
                } else {
                    input_analysis.next = PSBTRole::UPDATER;
                }
            } else {
                input_analysis.next = PSBTRole::FINALIZER;
            }
        } else if (!utxo.IsNull()){
            input_analysis.is_final = true;
        }
    }

    // Calculate next role for PSBT by grabbing "minimum" PSBTInput next role
    result.next = PSBTRole::EXTRACTOR;
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInputAnalysis& input_analysis = result.inputs[i];
        result.next = std::min(result.next, input_analysis.next);
    }
    assert(result.next > PSBTRole::CREATOR);

    if (calc_fee) {
        // Get the output amount
        CAmount out_amt = std::accumulate(psbtx.tx->vout.begin(), psbtx.tx->vout.end(), CAmount(0),
            [](CAmount a, const CTxOut& b) {
                if (!MoneyRange(a) || !MoneyRange(b.nValue) || !MoneyRange(a + b.nValue)) {
                    return CAmount(-1);
                }
                return a += b.nValue;
            }
        );
        if (!MoneyRange(out_amt)) {
            result.SetInvalid("PSBT is not valid. Output amount invalid");
            return result;
        }

        // Get the fee
        CAmount fee = in_amt - out_amt;
        result.fee = fee;

        // Estimate the size
        CMutableTransaction mtx(*psbtx.tx);
        CCoinsView view_dummy;
        CCoinsViewCache view(&view_dummy);
        bool success = true;

        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs[i];
            Coin newcoin;

            if (!SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, nullptr, 1) || !psbtx.GetInputUTXO(newcoin.out, i)) {
                success = false;
                break;
            } else {
                mtx.vin[i].scriptSig = input.final_script_sig;
                mtx.vin[i].scriptWitness = input.final_script_witness;
                newcoin.nHeight = 1;
                view.AddCoin(psbtx.tx->vin[i].prevout, std::move(newcoin), true);
            }
        }

        if (success) {
            CTransaction ctx = CTransaction(mtx);
            size_t size(GetVirtualTransactionSize(ctx, GetTransactionSigOpCost(ctx, view, STANDARD_SCRIPT_VERIFY_FLAGS), ::nBytesPerSigOp));
            result.estimated_vsize = size;
            // Estimate fee rate
            CFeeRate feerate(fee, size);
            result.estimated_feerate = feerate;
        }

    }

    return result;
}